

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this,IMessagePtr *message)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr this_00;
  long *plVar3;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *this_01;
  _Base_ptr p_Var4;
  int iVar5;
  _Atomic_word _Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var7;
  const_iterator __position;
  bool bVar8;
  _Iter in_R8;
  bool bVar9;
  insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>_>
  __result;
  LockT lock;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  copy;
  unique_lock<std::mutex> local_98;
  MessageQueue *local_88;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *local_80;
  _Base_ptr local_78;
  mutex *local_70;
  IMessagePtr *local_68;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  local_60;
  
  iVar5 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[2])();
  if (CONCAT44(extraout_var,iVar5) != 0) {
    iVar5 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_IMessage[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x10))
              ((long *)CONCAT44(extraout_var_00,iVar5),
               (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    return;
  }
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_owns = false;
  local_98._M_device = &this->queueMutex;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  local_78 = &(this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header;
  __result.iter._M_node = in_R8._M_node;
  __result.container =
       (set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
        *)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = this;
  local_70 = &this->queueMutex;
  local_68 = message;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>>,std::insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>>>
            ((__copy_move<false,false,std::bidirectional_iterator_tag> *)
             (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>)local_78,
             (_Base_ptr)&local_60,__result);
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    local_80 = (_Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
                *)&local_88->receivers;
    bVar8 = false;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      while (this_00 = p_Var7[1]._M_parent, this_00 != (_Base_ptr)0x0) {
        plVar3 = *(long **)(p_Var7 + 1);
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)((long)&this_00->_M_parent + 4);
          *p_Var1 = *p_Var1 + 1;
          UNLOCK();
        }
        else {
          p_Var1 = (_Atomic_word *)((long)&this_00->_M_parent + 4);
          *p_Var1 = *p_Var1 + 1;
        }
        _Var6 = *(_Atomic_word *)&this_00->_M_parent;
        do {
          if (_Var6 == 0) {
            bVar8 = true;
            goto LAB_001d1265;
          }
          LOCK();
          iVar5 = *(int *)&this_00->_M_parent;
          bVar9 = _Var6 == iVar5;
          if (bVar9) {
            *(_Atomic_word *)&this_00->_M_parent = _Var6 + 1;
            iVar5 = _Var6;
          }
          _Var6 = iVar5;
          UNLOCK();
        } while (!bVar9);
        bVar9 = true;
        if ((*(int *)&this_00->_M_parent != 0) && (plVar3 != (long *)0x0)) {
          (**(code **)(*plVar3 + 0x10))
                    (plVar3,(local_68->
                            super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
          bVar9 = bVar8;
        }
        bVar8 = bVar9;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
LAB_001d1265:
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)((long)&this_00->_M_parent + 4);
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = *(_Atomic_word *)((long)&this_00->_M_parent + 4);
          *(int *)((long)&this_00->_M_parent + 4) = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (**(code **)(*(long *)this_00 + 0x18))(this_00);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        if ((_Rb_tree_header *)p_Var7 == p_Var2) {
          if (!bVar8) goto LAB_001d130b;
          goto LAB_001d12a8;
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      bVar8 = true;
    } while ((_Rb_tree_header *)p_Var7 != p_Var2);
LAB_001d12a8:
    local_98._M_device = local_70;
    local_98._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_98);
    p_Var4 = local_78;
    this_01 = local_80;
    local_98._M_owns = true;
    __position._M_node = (local_88->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (__position._M_node != p_Var4) {
      if ((__position._M_node[1]._M_parent == (_Base_ptr)0x0) ||
         (*(int *)&(__position._M_node[1]._M_parent)->_M_parent == 0)) {
        __position._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
             ::erase_abi_cxx11_(this_01,__position);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_98);
  }
LAB_001d130b:
  std::
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageQueue::Dispatch(IMessagePtr message) {
    if (message->Target()) {
        message->Target()->ProcessMessage(*message);
    }
    else {
        std::set<IWeakMessageTarget, WeakPtrLess> copy;

        /* copy to dispatch outside of a lock */
        {
            LockT lock(this->queueMutex);
            std::copy(
                receivers.begin(),
                receivers.end(),
                std::inserter(copy, copy.begin()));
        }

        /* dispatch */
        bool prune = false;
        for (auto receiver : copy) {
            auto shared = receiver.lock();
            if (shared) {
                shared->ProcessMessage(*message);
            }
            else {
                prune = true;
            }
        }

        if (prune) { /* at least one of our weak_ptrs is dead. */
            LockT lock(this->queueMutex);
            auto it = this->receivers.begin();
            while (it != this->receivers.end()) {
                if (it->expired()) {
                    it = this->receivers.erase(it);
                }
                else {
                    ++it;
                }
            }
        }
    }
}